

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O0

int kputsn_(void *p,int l,kstring_t *s)

{
  char *pcVar1;
  char *tmp;
  kstring_t *s_local;
  int l_local;
  void *p_local;
  
  if (s->m < s->l + (long)l) {
    s->m = s->l + (long)l;
    s->m = s->m - 1;
    s->m = s->m >> 1 | s->m;
    s->m = s->m >> 2 | s->m;
    s->m = s->m >> 4 | s->m;
    s->m = s->m >> 8 | s->m;
    s->m = s->m >> 0x10 | s->m;
    s->m = s->m + 1;
    pcVar1 = (char *)realloc(s->s,s->m);
    if (pcVar1 == (char *)0x0) {
      return -1;
    }
    s->s = pcVar1;
  }
  memcpy(s->s + s->l,p,(long)l);
  s->l = (long)l + s->l;
  return l;
}

Assistant:

static inline int kputsn_(const void *p, int l, kstring_t *s)
{
	if (s->l + l > s->m) {
		char *tmp;
		s->m = s->l + l;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	memcpy(s->s + s->l, p, l);
	s->l += l;
	return l;
}